

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::javanano::FieldGeneratorMap::FieldGeneratorMap
          (FieldGeneratorMap *this,Descriptor *descriptor,Params *params)

{
  ulong __n;
  FieldGenerator *pFVar1;
  uint uVar2;
  uint uVar3;
  long *plVar4;
  FieldGenerator *pFVar5;
  scoped_ptr<google::protobuf::compiler::javanano::FieldGenerator> *psVar6;
  undefined1 uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int next_has_bit_index;
  int local_4c;
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::javanano::FieldGenerator>_>
  *local_48;
  FieldGeneratorMap *local_40;
  Params *local_38;
  
  this->descriptor_ = descriptor;
  lVar9 = (long)*(int *)(descriptor + 0x2c);
  __n = lVar9 * 8;
  uVar8 = __n + 8;
  if (0xfffffffffffffff7 < __n) {
    uVar8 = 0xffffffffffffffff;
  }
  local_48 = &this->field_generators_;
  if (lVar9 < 0) {
    uVar8 = 0xffffffffffffffff;
  }
  local_38 = params;
  plVar4 = (long *)operator_new__(uVar8);
  *plVar4 = lVar9;
  if (lVar9 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::javanano::FieldGenerator> *)(plVar4 + 1),0,__n);
  }
  local_48->array_ =
       (scoped_ptr<google::protobuf::compiler::javanano::FieldGenerator> *)(plVar4 + 1);
  local_4c = 0;
  if (*(int *)(descriptor + 0x2c) < 1) {
    uVar7 = false;
  }
  else {
    lVar10 = 0;
    lVar9 = 0;
    uVar3 = 0;
    local_40 = this;
    do {
      pFVar5 = MakeGenerator((FieldDescriptor *)(*(long *)(descriptor + 0x30) + lVar10),local_38,
                             &local_4c);
      uVar2 = uVar3 & 1;
      uVar3 = 1;
      if (uVar2 == 0) {
        uVar3 = (*pFVar5->_vptr_FieldGenerator[2])(pFVar5);
      }
      uVar7 = (undefined1)uVar3;
      psVar6 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::javanano::FieldGenerator>_>
               ::operator[](local_48,lVar9);
      pFVar1 = psVar6->ptr_;
      if (pFVar1 != pFVar5) {
        if (pFVar1 != (FieldGenerator *)0x0) {
          (*pFVar1->_vptr_FieldGenerator[1])();
        }
        psVar6->ptr_ = pFVar5;
      }
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0xa8;
      this = local_40;
    } while (lVar9 < *(int *)(descriptor + 0x2c));
  }
  this->total_bits_ = local_4c;
  this->saved_defaults_needed_ = (bool)uVar7;
  return;
}

Assistant:

FieldGeneratorMap::FieldGeneratorMap(
    const Descriptor* descriptor, const Params &params)
  : descriptor_(descriptor),
    field_generators_(
      new scoped_ptr<FieldGenerator>[descriptor->field_count()]) {

  int next_has_bit_index = 0;
  bool saved_defaults_needed = false;
  // Construct all the FieldGenerators.
  for (int i = 0; i < descriptor->field_count(); i++) {
    FieldGenerator* field_generator = MakeGenerator(
        descriptor->field(i), params, &next_has_bit_index);
    saved_defaults_needed = saved_defaults_needed
        || field_generator->SavedDefaultNeeded();
    field_generators_[i].reset(field_generator);
  }
  total_bits_ = next_has_bit_index;
  saved_defaults_needed_ = saved_defaults_needed;
}